

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IlmThreadPool.cpp
# Opt level: O2

void __thiscall IlmThread_3_2::TaskGroup::Data::waitForEmpty(Data *this)

{
  bool bVar1;
  int iVar2;
  void *in_RSI;
  
  Semaphore::wait(&this->isEmpty,in_RSI);
  do {
    iVar2 = 0;
    do {
      if ((this->inFlight).super___atomic_base<int>._M_i < 1) {
        return;
      }
      bVar1 = iVar2 < 100;
      iVar2 = iVar2 + 1;
    } while (bVar1);
    sched_yield();
  } while( true );
}

Assistant:

void
TaskGroup::Data::waitForEmpty ()
{
    //
    // A TaskGroup acts like an "inverted" semaphore: if the count
    // is above 0 then waiting on the taskgroup will block.  The
    // destructor waits until the taskgroup is empty before returning.
    //

    isEmpty.wait ();

    // pseudo spin to wait for the notifying thread to finish the post
    // to avoid a premature deletion of the semaphore
    int count = 0;
    while (inFlight.load () > 0)
    {
        ++count;
        if (count > 100)
        {
            std::this_thread::yield ();
            count = 0;
        }
    }
}